

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

void Vec_WecPush(Vec_Wec_t *p,int Level,int Entry)

{
  int iVar1;
  int nCapMin;
  Vec_Int_t *p_00;
  
  if (p->nSize <= Level) {
    iVar1 = Level + 1;
    nCapMin = p->nSize * 2;
    if (nCapMin <= iVar1) {
      nCapMin = iVar1;
    }
    Vec_WecGrow(p,nCapMin);
    p->nSize = iVar1;
  }
  p_00 = Vec_WecEntry(p,Level);
  Vec_IntPush(p_00,Entry);
  return;
}

Assistant:

static inline void Vec_WecPush( Vec_Wec_t * p, int Level, int Entry )
{
    if ( p->nSize < Level + 1 )
    {
        Vec_WecGrow( p, Abc_MaxInt(2*p->nSize, Level + 1) );
        p->nSize = Level + 1;
    }
    Vec_IntPush( Vec_WecEntry(p, Level), Entry );
}